

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<float,float,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,float *v,float v_min,float v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  float *pfVar4;
  float *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  uint in_R9D;
  float in_XMM0_Da;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float lhs;
  float fVar9;
  float fVar10;
  float in_XMM1_Da;
  undefined8 *in_stack_00000008;
  float grab_pos;
  float grab_t;
  float v_new_1;
  float new_clicked_t;
  float v_new;
  float old_clicked_t;
  float delta;
  int decimal_precision_1;
  float input_delta;
  ImVec2 input_delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  int decimal_precision;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  float v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_floating_point;
  bool is_logarithmic;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  int local_f8;
  float local_f4;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  float in_stack_ffffffffffffff18;
  float x1;
  undefined3 in_stack_ffffffffffffff24;
  uint uVar11;
  uint uVar12;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  float local_b4;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  float in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  undefined1 is_logarithmic_00;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff78;
  ImVec2 in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff84;
  float v_min_00;
  undefined2 in_stack_ffffffffffffff8c;
  byte bVar13;
  byte bVar14;
  float in_stack_ffffffffffffff90;
  float local_54;
  
  pIVar1 = GImGui;
  uVar3 = (uint)((in_R9D & 0x100000) != 0);
  uVar11 = CONCAT13(1,in_stack_ffffffffffffff24);
  if (in_EDX != 8) {
    uVar11 = CONCAT13(in_EDX == 9,in_stack_ffffffffffffff24);
  }
  uVar12 = uVar11;
  fVar5 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  fVar6 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar6 = (fVar5 - fVar6) - 4.0;
  local_54 = (pIVar1->Style).GrabMinSize;
  if (in_XMM1_Da <= in_XMM0_Da) {
    fVar7 = in_XMM0_Da - in_XMM1_Da;
  }
  else {
    fVar7 = in_XMM1_Da - in_XMM0_Da;
  }
  x1 = fVar7;
  local_f4 = in_stack_ffffffffffffff78;
  if (((uVar11 & 0x1000000) == 0) && (0.0 <= fVar7)) {
    local_54 = ImMax<float>(fVar6 / (fVar7 + 1.0),(pIVar1->Style).GrabMinSize);
    local_f4 = in_stack_ffffffffffffff78;
  }
  fVar8 = ImMin<float>(local_54,fVar6);
  lhs = fVar6 - fVar8;
  fVar9 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar9 = fVar8 * 0.5 + fVar9 + 2.0;
  fVar10 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  if ((in_R9D & 0x20) != 0) {
    if ((uVar11 & 0x1000000) == 0) {
      in_stack_ffffffffffffff18 = 1.4013e-45;
    }
    else {
      in_stack_ffffffffffffff18 =
           (float)ImParseFormatPrecision
                            ((char *)CONCAT44(x1,in_stack_ffffffffffffff18),
                             (int)in_stack_ffffffffffffff14);
    }
    in_stack_ffffffffffffff90 = in_stack_ffffffffffffff18;
    ImPow(0.0,2.399631e-39);
    in_stack_ffffffffffffff14 = (pIVar1->Style).LogSliderDeadzone * 0.5;
    ImMax<float>(lhs,1.0);
  }
  is_logarithmic_00 = (undefined1)((uint)in_stack_ffffffffffffff60 >> 0x18);
  bVar14 = 0;
  if (pIVar1->ActiveId == in_ESI) {
    bVar13 = 0;
    v_min_00 = 0.0;
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar1->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar4 = ImVec2::operator[](&(pIVar1->IO).MousePos,(long)(int)uVar3);
        in_stack_ffffffffffffff84 = *pfVar4;
        if (lhs <= 0.0) {
          in_stack_ffffffffffffff10 = 0.0;
        }
        else {
          in_stack_ffffffffffffff10 =
               ImClamp<float>((in_stack_ffffffffffffff84 - fVar9) / lhs,0.0,1.0);
        }
        v_min_00 = in_stack_ffffffffffffff10;
        if (uVar3 == 1) {
          v_min_00 = 1.0 - in_stack_ffffffffffffff10;
        }
        bVar13 = 1;
      }
    }
    else if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      if ((pIVar1->ActiveIdIsJustActivated & 1U) != 0) {
        pIVar1->SliderCurrentAccum = 0.0;
        pIVar1->SliderCurrentAccumDirty = false;
      }
      in_stack_ffffffffffffff7c =
           GetNavInputAmount2d((ImGuiNavDirSourceFlags)in_stack_ffffffffffffff5c,
                               (ImGuiInputReadMode)in_stack_ffffffffffffff58,
                               in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
      if (uVar3 == 0) {
        local_f4 = in_stack_ffffffffffffff7c.x;
      }
      else {
        local_f4 = -in_stack_ffffffffffffff7c.y;
      }
      if ((local_f4 != 0.0) || (NAN(local_f4))) {
        if ((uVar11 & 0x1000000) == 0) {
          local_f8 = 0;
        }
        else {
          local_f8 = ImParseFormatPrecision
                               ((char *)CONCAT44(x1,in_stack_ffffffffffffff18),
                                (int)in_stack_ffffffffffffff14);
        }
        if (local_f8 < 1) {
          if (((-100.0 <= fVar7) && (fVar7 <= 100.0)) || (bVar2 = IsNavInputDown(0xe), bVar2)) {
            local_f4 = (float)(~-(uint)(local_f4 < 0.0) & 0x3f800000 |
                              -(uint)(local_f4 < 0.0) & 0xbf800000) / fVar7;
          }
          else {
            local_f4 = local_f4 / 100.0;
          }
        }
        else {
          local_f4 = local_f4 / 100.0;
          bVar2 = IsNavInputDown(0xe);
          if (bVar2) {
            local_f4 = local_f4 / 10.0;
          }
        }
        bVar2 = IsNavInputDown(0xf);
        if (bVar2) {
          local_f4 = local_f4 * 10.0;
        }
        pIVar1->SliderCurrentAccum = local_f4 + pIVar1->SliderCurrentAccum;
        pIVar1->SliderCurrentAccumDirty = true;
      }
      in_stack_ffffffffffffff70 = pIVar1->SliderCurrentAccum;
      if ((pIVar1->NavActivatePressedId == in_ESI) && ((pIVar1->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((pIVar1->SliderCurrentAccumDirty & 1U) != 0) {
        v_min_00 = ScaleRatioFromValueT<float,float,float>
                             ((ImGuiDataType)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                              in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                              SUB41((uint)in_stack_ffffffffffffff60 >> 0x18,0),
                              in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
        if (((1.0 <= v_min_00) && (0.0 < in_stack_ffffffffffffff70)) ||
           ((v_min_00 <= 0.0 && (in_stack_ffffffffffffff70 < 0.0)))) {
          bVar13 = 0;
          pIVar1->SliderCurrentAccum = 0.0;
        }
        else {
          bVar13 = 1;
          fVar7 = ImSaturate(v_min_00 + in_stack_ffffffffffffff70);
          in_stack_ffffffffffffff68 =
               ScaleValueFromRatioT<float,float,float>
                         ((ImGuiDataType)in_stack_ffffffffffffff90,
                          (float)CONCAT13(bVar14,CONCAT12(bVar13,in_stack_ffffffffffffff8c)),fVar7,
                          in_stack_ffffffffffffff84,in_stack_ffffffffffffff7c.y._3_1_,
                          in_stack_ffffffffffffff7c.x,local_f4);
          in_stack_ffffffffffffff6c = v_min_00;
          if ((in_R9D & 0x40) == 0) {
            in_stack_ffffffffffffff68 =
                 RoundScalarWithFormatT<float,float>
                           ((char *)CONCAT17(bVar14,CONCAT16(bVar13,CONCAT24(
                                                  in_stack_ffffffffffffff8c,fVar7))),
                            (ImGuiDataType)in_stack_ffffffffffffff84,in_stack_ffffffffffffff7c.y);
            in_stack_ffffffffffffff6c = v_min_00;
          }
          v_min_00 = fVar7;
          in_stack_ffffffffffffff64 =
               ScaleRatioFromValueT<float,float,float>
                         ((ImGuiDataType)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                          in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                          SUB41((uint)in_stack_ffffffffffffff60 >> 0x18,0),in_stack_ffffffffffffff5c
                          ,in_stack_ffffffffffffff58);
          if (in_stack_ffffffffffffff70 <= 0.0) {
            fVar7 = ImMax<float>(in_stack_ffffffffffffff64 - in_stack_ffffffffffffff6c,
                                 in_stack_ffffffffffffff70);
            pIVar1->SliderCurrentAccum = pIVar1->SliderCurrentAccum - fVar7;
          }
          else {
            fVar7 = ImMin<float>(in_stack_ffffffffffffff64 - in_stack_ffffffffffffff6c,
                                 in_stack_ffffffffffffff70);
            pIVar1->SliderCurrentAccum = pIVar1->SliderCurrentAccum - fVar7;
          }
        }
        pIVar1->SliderCurrentAccumDirty = false;
      }
    }
    if ((bVar13 & 1) != 0) {
      in_stack_ffffffffffffff60 =
           ScaleValueFromRatioT<float,float,float>
                     ((ImGuiDataType)in_stack_ffffffffffffff90,
                      (float)CONCAT13(bVar14,CONCAT12(bVar13,in_stack_ffffffffffffff8c)),v_min_00,
                      in_stack_ffffffffffffff84,in_stack_ffffffffffffff7c.y._3_1_,
                      in_stack_ffffffffffffff7c.x,local_f4);
      if ((in_R9D & 0x40) == 0) {
        in_stack_ffffffffffffff60 =
             RoundScalarWithFormatT<float,float>
                       ((char *)CONCAT17(bVar14,CONCAT16(bVar13,CONCAT24(in_stack_ffffffffffffff8c,
                                                                         v_min_00))),
                        (ImGuiDataType)in_stack_ffffffffffffff84,in_stack_ffffffffffffff7c.y);
      }
      if ((*in_RCX != in_stack_ffffffffffffff60) || (NAN(*in_RCX) || NAN(in_stack_ffffffffffffff60))
         ) {
        *in_RCX = in_stack_ffffffffffffff60;
        bVar14 = 1;
      }
    }
    is_logarithmic_00 = (undefined1)((uint)in_stack_ffffffffffffff60 >> 0x18);
  }
  if (1.0 <= fVar6) {
    local_b4 = ScaleRatioFromValueT<float,float,float>
                         ((ImGuiDataType)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                          in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                          (bool)is_logarithmic_00,in_stack_ffffffffffffff5c,
                          in_stack_ffffffffffffff58);
    if (uVar3 == 1) {
      local_b4 = 1.0 - local_b4;
    }
    ImLerp<float>(fVar9,-fVar8 * 0.5 + (fVar10 - 2.0),local_b4);
    if (uVar3 == 0) {
      ImRect::ImRect((ImRect *)CONCAT44(uVar12,fVar5),x1,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
      *in_stack_00000008 = local_c8;
      in_stack_00000008[1] = local_c0;
    }
    else {
      ImRect::ImRect((ImRect *)CONCAT44(uVar12,fVar5),x1,in_stack_ffffffffffffff18,
                     in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
      *in_stack_00000008 = local_d8;
      in_stack_00000008[1] = local_d0;
    }
  }
  else {
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff50,in_RDI,in_RDI);
    *in_stack_00000008 = CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
    in_stack_00000008[1] = CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  }
  return (bool)(bVar14 & 1);
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_floating_point && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}